

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndr.h
# Opt level: O2

void Ndr_DataPushArray(Ndr_Data_t *p,int Type,int nArray,int *pArray)

{
  if (nArray != 0) {
    if (nArray < 1) {
      __assert_fail("nArray > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/miniaig/ndr.h"
                    ,0xcc,"void Ndr_DataPushArray(Ndr_Data_t *, int, int, int *)");
    }
    Ndr_DataResize(p,nArray);
    memset(p->pHead + p->nSize,Type,(ulong)(uint)nArray);
    memcpy(p->pBody + p->nSize,pArray,(ulong)(uint)nArray << 2);
    p->nSize = p->nSize + nArray;
  }
  return;
}

Assistant:

static inline void Ndr_DataPushArray( Ndr_Data_t * p, int Type, int nArray, int * pArray )
{ 
    if ( !nArray )
        return;
    assert( nArray > 0 );
    Ndr_DataResize( p, nArray );
    memset( p->pHead + p->nSize, Type, (size_t)nArray );
    memcpy( p->pBody + p->nSize, pArray, (size_t)4*nArray );
    p->nSize += nArray;
}